

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  bool bVar2;
  uint32 uVar3;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField",
               "Field is repeated; the method requires a singular field.");
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    bVar2 = ExtensionSet::Has((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3)
                              ,*(int *)(field + 0x38));
    return bVar2;
  }
  lVar1 = *(long *)(field + 0x60);
  if (lVar1 != 0) {
    return *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                   (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40)) >>
                                      4) * -0x55555554 + (this->schema_).oneof_case_offset_)) ==
           *(int *)(field + 0x38);
  }
  bVar2 = HasBit(this,message,field);
  return bVar2;
}

Assistant:

bool GeneratedMessageReflection::HasField(const Message& message,
                                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (field->containing_oneof()) {
      return HasOneofField(message, field);
    } else {
      return HasBit(message, field);
    }
  }
}